

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::updateGeometries(QTreeView *this)

{
  QTreeViewPrivate *this_00;
  QWidget *this_01;
  QWidgetData *pQVar1;
  int iVar2;
  int extraout_var;
  int top;
  long in_FS_OFFSET;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  this_01 = (QWidget *)this_00->header;
  if (this_01 != (QWidget *)0x0) {
    if (this_00->geometryRecursionBlock != false) goto LAB_00547587;
    this_00->geometryRecursionBlock = true;
    top = 0;
    if ((this_01->data->widget_attributes & 0x10000) == 0) {
      iVar2 = QWidget::minimumHeight(this_01);
      (**(code **)(*(long *)&(this_00->header->super_QAbstractItemView).super_QAbstractScrollArea.
                             super_QFrame.super_QWidget + 0x70))();
      top = extraout_var;
      if (extraout_var < iVar2) {
        top = iVar2;
      }
      iVar2 = QWidget::maximumHeight((QWidget *)this_00->header);
      if (iVar2 <= top) {
        top = iVar2;
      }
    }
    QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this,0,top,0,0);
    pQVar1 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_38.x1.m_i = (pQVar1->crect).x1.m_i;
    iVar2 = (pQVar1->crect).y1.m_i;
    local_38.x2.m_i = (pQVar1->crect).x2.m_i;
    local_38.y1.m_i = iVar2 - top;
    local_38.y2.m_i = iVar2 + -1;
    QWidget::setGeometry((QWidget *)this_00->header,&local_38);
    QMetaObject::invokeMethod<>((QObject *)this_00->header,"updateGeometries");
    QTreeViewPrivate::updateScrollBars(this_00);
    this_00->geometryRecursionBlock = false;
  }
  QAbstractItemView::updateGeometries((QAbstractItemView *)this);
LAB_00547587:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::updateGeometries()
{
    Q_D(QTreeView);
    if (d->header) {
        if (d->geometryRecursionBlock)
            return;
        d->geometryRecursionBlock = true;
        int height = 0;
        if (!d->header->isHidden()) {
            height = qMax(d->header->minimumHeight(), d->header->sizeHint().height());
            height = qMin(height, d->header->maximumHeight());
        }
        setViewportMargins(0, height, 0, 0);
        QRect vg = d->viewport->geometry();
        QRect geometryRect(vg.left(), vg.top() - height, vg.width(), height);
        d->header->setGeometry(geometryRect);
        QMetaObject::invokeMethod(d->header, "updateGeometries");
        d->updateScrollBars();
        d->geometryRecursionBlock = false;
    }
    QAbstractItemView::updateGeometries();
}